

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

int main(void)

{
  cake_iterator<false> first;
  cake_iterator<false> first_00;
  cake_iterator<false> last;
  cake_iterator<false> last_00;
  initializer_list<double> l;
  initializer_list<int> __l;
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  iterator last_01;
  SLNode<double> *local_1fb8 [2];
  SLNode<double> *local_1fa8;
  iterator local_1fa0;
  double local_1f88 [3];
  iterator local_1f70;
  undefined8 local_1f68;
  undefined1 local_1f60 [8];
  skiplist<double,_std::less<double>_> slFromInitializer;
  undefined8 uStack_1550;
  undefined8 local_1548;
  iterator local_1540;
  int *local_1528;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1520;
  undefined1 local_1518 [8];
  skiplist<int,_std::less<int>_> skiplistFromVector;
  int local_b08 [8];
  iterator local_ae8;
  size_type local_ae0;
  undefined1 local_ad8 [8];
  vector<int,_std::allocator<int>_> v;
  undefined1 local_ab8 [4];
  int i_1;
  skiplist<int,_std::less<int>_> iskip;
  iterator iStack_a8;
  int e;
  iterator __end1;
  iterator __begin1;
  multiset<int,_std::less<int>,_std::allocator<int>_> *__range1;
  _Base_ptr local_88;
  key_type local_7c;
  _Base_ptr local_78;
  iterator it;
  key_type local_68 [2];
  _Base_ptr local_60;
  int local_48;
  int local_44;
  undefined1 local_40 [4];
  int i;
  multiset<int,_std::less<int>,_std::allocator<int>_> iset;
  
  iset._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
    local_48 = local_44 % 5;
    local_60 = (_Base_ptr)
               std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,&local_48)
    ;
  }
  local_68[1] = 0;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::erase
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,local_68 + 1);
  local_68[0] = 0;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::erase
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,local_68);
  it._M_node._4_4_ = 1;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::erase
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,
             (key_type *)((long)&it._M_node + 4));
  local_7c = 2;
  local_78 = (_Base_ptr)
             std::multiset<int,_std::less<int>,_std::allocator<int>_>::find
                       ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,&local_7c);
  __range1._4_4_ = 7;
  local_88 = (_Base_ptr)
             std::multiset<int,_std::less<int>,_std::allocator<int>_>::find
                       ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,
                        (key_type *)((long)&__range1 + 4));
  local_78 = local_88;
  std::operator<<((ostream *)&std::cout,"The mulitset has:\n");
  __end1 = std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  iStack_a8 = std::multiset<int,_std::less<int>,_std::allocator<int>_>::end
                        ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffff58);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    iskip._2564_4_ = *piVar2;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iskip._2564_4_);
    std::operator<<(poVar3," ");
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  skiplist<int,_std::less<int>_>::skiplist((skiplist<int,_std::less<int>_> *)local_ab8);
  std::operator<<((ostream *)&std::cout,"Inserting into the skip list:\n");
  for (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 10;
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    skiplist<int,_std::less<int>_>::insert
              ((skiplist<int,_std::less<int>_> *)local_ab8,
               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ % 5);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ % 5);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_ab8,0);
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_ab8,0);
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_ab8,2);
  foundit((skiplist<int,_std::less<int>_> *)local_ab8,2);
  foundit((skiplist<int,_std::less<int>_> *)local_ab8,7);
  local_b08[0] = 10;
  local_b08[1] = 4;
  local_b08[2] = 3;
  local_b08[3] = 6;
  local_b08[4] = 1;
  local_ae8 = local_b08;
  local_ae0 = 5;
  std::allocator<int>::allocator((allocator<int> *)&skiplistFromVector.field_0xa07);
  __l._M_len = local_ae0;
  __l._M_array = local_ae8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_ad8,__l,
             (allocator_type *)&skiplistFromVector.field_0xa07);
  std::allocator<int>::~allocator((allocator<int> *)&skiplistFromVector.field_0xa07);
  local_1520._M_current =
       (int *)std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_ad8);
  last_01 = std::end<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_ad8);
  local_1528 = last_01._M_current;
  skiplist<int,std::less<int>>::
  skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((skiplist<int,std::less<int>> *)local_1518,local_1520,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last_01._M_current);
  std::operator<<((ostream *)&std::cout,"Skiplist constructed from vector:\n");
  std::begin<skiplist<int,std::less<int>>>(&local_1540,(skiplist<int,_std::less<int>_> *)local_1518)
  ;
  std::end<skiplist<int,std::less<int>>>
            ((iterator *)&slFromInitializer.field_0xa00,(skiplist<int,_std::less<int>_> *)local_1518
            );
  first._8_8_ = local_1540.node;
  first._0_8_ = local_1540._8_8_;
  first.node = (SLNode<int> *)slFromInitializer._2560_8_;
  last._8_8_ = local_1548;
  last._0_8_ = uStack_1550;
  last.node = (SLNode<int> *)last_01._M_current;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first,last);
  local_1f88[0] = 1.1;
  local_1f88[1] = 0.5;
  local_1f88[2] = 100.3;
  local_1f70 = local_1f88;
  local_1f68 = 3;
  l._M_len = 3;
  l._M_array = local_1f70;
  skiplist<double,_std::less<double>_>::skiplist
            ((skiplist<double,_std::less<double>_> *)local_1f60,l);
  std::operator<<((ostream *)&std::cout,"Skiplist constructed using initialzer_list:\n");
  std::begin<skiplist<double,std::less<double>>>
            (&local_1fa0,(skiplist<double,_std::less<double>_> *)local_1f60);
  std::end<skiplist<double,std::less<double>>>
            ((iterator *)local_1fb8,(skiplist<double,_std::less<double>_> *)local_1f60);
  first_00._8_8_ = local_1fa0.node;
  first_00._0_8_ = local_1fa0._8_8_;
  first_00.node = local_1fb8[0];
  last_00._8_8_ = local_1fa8;
  last_00._0_8_ = local_1fb8[1];
  last_00.node = (SLNode<double> *)last_01._M_current;
  display<skiplist<double,std::less<double>>::cake_iterator<false>>(first_00,last_00);
  std::operator<<((ostream *)&std::cout,"No runtime exceptions. YAY!\n");
  skiplist<double,_std::less<double>_>::~skiplist
            ((skiplist<double,_std::less<double>_> *)local_1f60);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_1518);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_ad8);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_ab8);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  return iset._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main() {
    // set operations
    std::multiset<int> iset;
    for(int i=0; i<10; i++)
        iset.insert(i%5);
    iset.erase(0);
    iset.erase(0);
    iset.erase(1);
    std::multiset<int>::iterator it = iset.find(2);
    it = iset.find(7);

    cout << "The mulitset has:\n";
    for(auto e: iset) {
        cout << e << " ";
    }
    cout << "\n";

    // skip list operations, must mirror the multiset operations
    skiplist<int> iskip;

    cout << "Inserting into the skip list:\n";
    for(int i=0; i<10; i++)
    {
        iskip.insert(i%5);
        cout << i%5 << " ";
    }
    cout << "\n";

    iskip.erase(0);
    iskip.erase(0);
    iskip.erase(2);

    foundit(iskip, 2);
    foundit(iskip, 7);

	std::vector<int> v = {10, 4, 3, 6, 1};
	skiplist<int> skiplistFromVector(begin(v), end(v));
	cout << "Skiplist constructed from vector:\n";
	display(begin(skiplistFromVector), end(skiplistFromVector));

	skiplist<double> slFromInitializer = {1.1, 0.5, 100.3};
	cout << "Skiplist constructed using initialzer_list:\n";
	display(begin(slFromInitializer), end(slFromInitializer));
    cout << "No runtime exceptions. YAY!\n";
}